

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  byte bVar1;
  Op *pOVar2;
  int iVar3;
  char *p;
  byte *pbVar4;
  sqlite_int64 iRow_00;
  Incrblob *p_00;
  Parse *pPVar5;
  Table *pTVar6;
  Index *pIVar7;
  Vdbe *p_01;
  FKey *pFVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Schema **ppSVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  ulong uVar19;
  char *local_b0;
  uint local_a4;
  Parse *local_a0;
  Incrblob *local_98;
  Table *local_90;
  int local_84;
  int local_80;
  int local_7c;
  int *local_78;
  ulong local_70;
  byte *local_68;
  char *local_60;
  sqlite3 *local_58;
  ulong local_50;
  char **local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_b0 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_80 = flags;
  local_68 = (byte *)zColumn;
  local_60 = zTable;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p_00 = (Incrblob *)sqlite3DbMallocRaw(db,0x28);
  if (p_00 == (Incrblob *)0x0) {
LAB_00122a39:
    pPVar5 = (Parse *)0x0;
LAB_00122a3b:
    iVar9 = 0;
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p_00;
      pcVar14 = "%s";
      if (local_b0 == (char *)0x0) {
        pcVar14 = (char *)0x0;
      }
      iVar9 = 0;
      goto LAB_00122ad3;
    }
LAB_00122a9a:
    if (p_00 != (Incrblob *)0x0) goto LAB_00122aa2;
  }
  else {
    p_00->pCsr = (BtCursor *)0x0;
    p_00->pStmt = (sqlite3_stmt *)0x0;
    p_00->flags = 0;
    p_00->nByte = 0;
    p_00->iOffset = 0;
    p_00->iCol = 0;
    p_00->db = (sqlite3 *)0x0;
    pPVar5 = (Parse *)sqlite3DbMallocRaw(db,0x298);
    if (pPVar5 == (Parse *)0x0) goto LAB_00122a39;
    local_70 = 0;
    local_a4 = (uint)(flags != 0);
    local_7c = 4 - (uint)(local_80 != 0);
    local_50 = (ulong)((local_80 != 0) + 3);
    local_48 = &pPVar5->zErrMsg;
    iVar9 = 0;
    local_a0 = pPVar5;
    local_98 = p_00;
    do {
      memset(local_48,0,0x290);
      pPVar5 = local_a0;
      local_a0->db = db;
      sqlite3DbFree(db,local_b0);
      local_b0 = (char *)0x0;
      sqlite3BtreeEnterAll(db);
      pTVar6 = sqlite3LocateTable(pPVar5,0,local_60,local_38);
      pbVar4 = local_68;
      p_00 = local_98;
      if (pTVar6 == (Table *)0x0) {
LAB_00122b43:
        pPVar5 = local_a0;
        if (local_a0->zErrMsg != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          local_b0 = pPVar5->zErrMsg;
          pPVar5->zErrMsg = (char *)0x0;
        }
        sqlite3BtreeLeaveAll(db);
        iVar9 = 1;
        p_00 = local_98;
        goto LAB_00122aa2;
      }
      if ((pTVar6->tabFlags & 0x10) != 0) {
        pcVar14 = "cannot open virtual table: %s";
LAB_00122b32:
        sqlite3ErrorMsg(local_a0,pcVar14,local_60);
        goto LAB_00122b43;
      }
      if (pTVar6->pSelect != (Select *)0x0) {
        pcVar14 = "cannot open view: %s";
        goto LAB_00122b32;
      }
      uVar10 = (uint)pTVar6->nCol;
      local_90 = pTVar6;
      local_84 = iVar9;
      if (0 < (int)uVar10) {
        uVar16 = 0;
        do {
          pbVar18 = (byte *)pTVar6->aCol[uVar16].zName;
          bVar1 = *pbVar18;
          pbVar17 = local_68;
          while (bVar1 != 0) {
            uVar19 = (ulong)bVar1;
            pbVar18 = pbVar18 + 1;
            if (""[uVar19] != ""[*pbVar17]) goto LAB_00122748;
            pbVar17 = pbVar17 + 1;
            bVar1 = *pbVar18;
          }
          uVar19 = 0;
LAB_00122748:
          if (""[uVar19] == ""[*pbVar17]) goto LAB_00122772;
          uVar16 = uVar16 + 1;
          if (uVar16 == uVar10) goto LAB_00122a61;
        } while( true );
      }
      uVar16 = 0;
LAB_00122772:
      uVar15 = (uint)uVar16;
      if (uVar15 == uVar10) {
LAB_00122a61:
        sqlite3DbFree(db,(void *)0x0);
        local_b0 = sqlite3MPrintf(db,"no such column: \"%s\"",pbVar4);
LAB_00122a82:
        sqlite3BtreeLeaveAll(db);
        iVar9 = 1;
        pPVar5 = local_a0;
        goto LAB_00122a9a;
      }
      if (local_80 != 0) {
        if ((db->flags & 0x40000) == 0) {
          pcVar14 = (char *)0x0;
        }
        else {
          pcVar14 = (char *)0x0;
          for (pFVar8 = pTVar6->pFKey; pFVar8 != (FKey *)0x0; pFVar8 = pFVar8->pNextFrom) {
            if (0 < (long)pFVar8->nCol) {
              lVar13 = 0;
              do {
                if (*(uint *)((long)&pFVar8->aCol[0].iFrom + lVar13) == uVar15) {
                  pcVar14 = "foreign key";
                }
                lVar13 = lVar13 + 0x10;
              } while ((long)pFVar8->nCol * 0x10 != lVar13);
            }
          }
        }
        for (pIVar7 = pTVar6->pIndex; pIVar7 != (Index *)0x0; pIVar7 = pIVar7->pNext) {
          if ((ulong)pIVar7->nColumn != 0) {
            uVar16 = 0;
            do {
              if (pIVar7->aiColumn[uVar16] == uVar15) {
                pcVar14 = "indexed";
              }
              uVar16 = uVar16 + 1;
            } while (pIVar7->nColumn != uVar16);
          }
        }
        if (pcVar14 != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          local_b0 = sqlite3MPrintf(db,"cannot open %s column for writing",pcVar14);
          p_00 = local_98;
          goto LAB_00122a82;
        }
      }
      p_01 = sqlite3VdbeCreate(db);
      local_98->pStmt = (sqlite3_stmt *)p_01;
      if (p_01 != (Vdbe *)0x0) {
        if (local_90->pSchema == (Schema *)0x0) {
          uVar16 = 0xfff0bdc0;
        }
        else {
          uVar10 = db->nDb;
          if ((int)uVar10 < 1) {
            uVar16 = 0;
          }
          else {
            ppSVar12 = &db->aDb->pSchema;
            uVar16 = 0;
            do {
              if (*ppSVar12 == local_90->pSchema) goto LAB_00122869;
              uVar16 = uVar16 + 1;
              ppSVar12 = ppSVar12 + 4;
            } while (uVar10 != uVar16);
            uVar16 = (ulong)uVar10;
          }
        }
LAB_00122869:
        local_58 = db;
        sqlite3VdbeAddOpList(p_01,0xc,sqlite3_blob_open::openBlob);
        uVar10 = p_01->nOp;
        iVar9 = (int)uVar16;
        if (uVar10 != 0) {
          pOVar2 = p_01->aOp;
          pOVar2->p1 = iVar9;
          pOVar2->p2 = local_a4;
          if (uVar10 != 1) {
            pOVar2[1].p1 = iVar9;
            iVar3 = local_90->pSchema->iGeneration;
            pOVar2[1].p2 = local_90->pSchema->schema_cookie;
            pOVar2[1].p3 = iVar3;
          }
        }
        uVar11 = 1 << ((byte)uVar16 & 0x1f);
        p_01->btreeMask = p_01->btreeMask | uVar11;
        if ((iVar9 != 1) && ((p_01->db->aDb[iVar9].pBt)->sharable != '\0')) {
          p_01->lockMask = p_01->lockMask | uVar11;
        }
        if (2 < uVar10) {
          pOVar2 = p_01->aOp;
          pOVar2[2].p1 = iVar9;
          pOVar2[2].p2 = local_90->tnum;
          pOVar2[2].p3 = local_a4;
        }
        local_78 = &local_90->tnum;
        sqlite3VdbeChangeP4(p_01,2,local_90->zName,0);
        sqlite3VdbeChangeToNoop(p_01,local_7c);
        pTVar6 = local_90;
        if ((uint)local_50 < (uint)p_01->nOp) {
          pOVar2 = p_01->aOp;
          pOVar2[local_50].p2 = *local_78;
          pOVar2[local_50].p3 = iVar9;
        }
        sqlite3VdbeChangeP4(p_01,(uint)local_50,(char *)((long)local_90->nCol + 1),-0xe);
        db = local_58;
        if (7 < (uint)p_01->nOp) {
          p_01->aOp[7].p2 = (int)pTVar6->nCol;
        }
        if (local_58->mallocFailed == '\0') {
          local_a0->nVar = 1;
          local_a0->nTab = 1;
          local_a0->nMem = 1;
          sqlite3VdbeMakeReady(p_01,local_a0);
        }
      }
      p_00 = local_98;
      local_98->flags = local_a4;
      local_98->iCol = uVar15;
      local_98->db = db;
      sqlite3BtreeLeaveAll(db);
      iRow_00 = local_40;
      if (db->mallocFailed != '\0') break;
      sqlite3_bind_int64(p_00->pStmt,1,local_40);
      local_84 = blobSeekToRow(p_00,iRow_00,&local_b0);
      if (0x30 < (uint)local_70) break;
      local_70 = (ulong)((uint)local_70 + 1);
      iVar9 = 0x11;
    } while (local_84 == 0x11);
    pPVar5 = local_a0;
    iVar9 = local_84;
    if (local_84 == 0) goto LAB_00122a3b;
LAB_00122aa2:
    if ((Vdbe *)p_00->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
    }
  }
  sqlite3DbFree(db,p_00);
  pcVar14 = "%s";
  if (local_b0 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
LAB_00122ad3:
  p = local_b0;
  sqlite3Error(db,iVar9,pcVar14,local_b0);
  sqlite3DbFree(db,p);
  sqlite3DbFree(db,pPVar5);
  iVar9 = sqlite3ApiExit(db,iVar9);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar9;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const VdbeOpList openBlob[] = {
    {OP_Transaction, 0, 0, 0},     /* 0: Start a transaction */
    {OP_VerifyCookie, 0, 0, 0},    /* 1: Check the schema cookie */
    {OP_TableLock, 0, 0, 0},       /* 2: Acquire a read or write lock */

    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 3: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 4: Open cursor 0 for read/write */

    {OP_Variable, 1, 1, 1},        /* 5: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 6: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 7  */
    {OP_ResultRow, 1, 0, 0},       /* 8  */
    {OP_Goto, 0, 5, 0},            /* 9  */
    {OP_Close, 0, 0, 0},           /* 10 */
    {OP_Halt, 0, 0, 0},            /* 11 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

  flags = !!flags;                /* flags = (flags ? 1 : 0); */
  *ppBlob = 0;

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nColumn; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(db);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

      sqlite3VdbeAddOpList(v, sizeof(openBlob)/sizeof(VdbeOpList), openBlob);


      /* Configure the OP_Transaction */
      sqlite3VdbeChangeP1(v, 0, iDb);
      sqlite3VdbeChangeP2(v, 0, flags);

      /* Configure the OP_VerifyCookie */
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->pSchema->schema_cookie);
      sqlite3VdbeChangeP3(v, 1, pTab->pSchema->iGeneration);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 2);
#else
      sqlite3VdbeChangeP1(v, 2, iDb);
      sqlite3VdbeChangeP2(v, 2, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2, flags);
      sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 4 - flags);
      sqlite3VdbeChangeP2(v, 3 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 3 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 3+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 7, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3Error(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}